

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deque.h
# Opt level: O1

bool __thiscall
__gnu_cxx::__ops::_Iter_less_iter::operator()
          (_Iter_less_iter *this,
          DequeIterator<int,_int_&,_int_*,_Deque<int,_std::allocator<int>_>_> *__it1,
          DequeIterator<int,_int_&,_int_*,_Deque<int,_std::allocator<int>_>_> *__it2)

{
  Deque<int,_std::allocator<int>_> *pDVar1;
  DataBlock **ppDVar2;
  ulong uVar3;
  DataBlock **ppDVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  
  pDVar1 = __it1->deque_;
  ppDVar2 = (pDVar1->current_).begin_;
  uVar3 = (pDVar1->current_).allocSize_;
  uVar8 = ((long)(*ppDVar2)->begin - (long)(*ppDVar2)->buffer >> 2) + __it1->n_;
  uVar6 = uVar8 >> 8;
  lVar9 = -uVar3;
  if ((ulong)((long)((long)ppDVar2 + (uVar6 * 8 - (long)(pDVar1->current_).arr_)) >> 3) < uVar3) {
    lVar9 = 0;
  }
  pDVar1 = __it2->deque_;
  ppDVar4 = (pDVar1->current_).begin_;
  uVar3 = (pDVar1->current_).allocSize_;
  uVar10 = ((long)(*ppDVar4)->begin - (long)(*ppDVar4)->buffer >> 2) + __it2->n_;
  uVar5 = uVar10 >> 8;
  lVar7 = -uVar3;
  if ((ulong)((long)((long)ppDVar4 + (uVar5 * 8 - (long)(pDVar1->current_).arr_)) >> 3) < uVar3) {
    lVar7 = 0;
  }
  return ppDVar2[uVar6 + lVar9]->buffer[(uint)uVar8 & 0xff] <
         ppDVar4[uVar5 + lVar7]->buffer[(uint)uVar10 & 0xff];
}

Assistant:

RefType operator *() const {
            return deque_->at(n_);
        }